

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOSystem.cpp
# Opt level: O3

string * MakeAbsolutePath_abi_cxx11_(string *__return_storage_ptr__,char *in)

{
  char *pcVar1;
  char *pcVar2;
  string *extraout_RAX;
  Logger *this;
  string *psVar3;
  allocator local_1d9;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  char *local_1b8;
  char local_1a8 [16];
  undefined1 local_198 [376];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar2 = realpath(in,(char *)0x0);
  if (pcVar2 != (char *)0x0) {
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(pcVar2);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)pcVar2);
    free(pcVar2);
    return extraout_RAX;
  }
  this = Assimp::DefaultLogger::get();
  Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[15]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [15])"Invalid path: ");
  std::__cxx11::string::string((string *)&local_1d8,in,&local_1d9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,local_1d8,local_1d0);
  std::__cxx11::stringbuf::str();
  Assimp::Logger::warn(this,local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
  strlen(in);
  psVar3 = (string *)
           std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)in);
  return psVar3;
}

Assistant:

inline static std::string MakeAbsolutePath(const char* in)
{
    ai_assert(in);
    std::string out;
#ifdef _WIN32
    wchar_t* ret = ::_wfullpath(nullptr, Utf8ToWide(in).c_str(), 0);
    if (ret) {
        out = WideToUtf8(ret);
        free(ret);
    }
#else
    char* ret = realpath(in, nullptr);
    if (ret) {
        out = ret;
        free(ret);
    }
#endif
    if (!ret) {
        // preserve the input path, maybe someone else is able to fix
        // the path before it is accessed (e.g. our file system filter)
        ASSIMP_LOG_WARN_F("Invalid path: ", std::string(in));
        out = in;
    }
    return out;
}